

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

_Bool CheckCollisionLines(Vector2 startPos1,Vector2 endPos1,Vector2 startPos2,Vector2 endPos2,
                         Vector2 *collisionPoint)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float __y;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float __x;
  float __x_00;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float __y_00;
  float __y_01;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 local_78;
  
  __y_00 = endPos2.x;
  __y_01 = endPos2.y;
  __x = startPos2.x;
  __x_00 = startPos2.y;
  fVar3 = endPos1.x;
  __y = endPos1.y;
  fVar2 = startPos1.x;
  fVar4 = startPos1.y;
  fVar6 = (fVar3 - fVar2) * (__y_01 - __x_00) - (__y - fVar4) * (__y_00 - __x);
  if ((fVar6 == 0.0) && (!NAN(fVar6))) {
    return false;
  }
  fVar7 = fVar2 * __y - fVar3 * fVar4;
  fVar5 = __x * __y_01 - __y_00 * __x_00;
  auVar8._0_4_ = fVar7 * (__x - __y_00) - fVar5 * (fVar2 - fVar3);
  auVar8._4_4_ = fVar7 * (__x_00 - __y_01) - fVar5 * (fVar4 - __y);
  auVar8._8_4_ = fVar7 * (in_XMM2_Dc - in_XMM3_Dc) - fVar5 * (in_XMM0_Dc - in_XMM1_Dc);
  auVar8._12_4_ = fVar7 * (in_XMM2_Dd - in_XMM3_Dd) - fVar5 * (in_XMM0_Dd - in_XMM1_Dd);
  auVar9._4_4_ = fVar6;
  auVar9._0_4_ = fVar6;
  auVar9._8_4_ = fVar6;
  auVar9._12_4_ = fVar6;
  auVar9 = divps(auVar8,auVar9);
  fVar6 = fminf(fVar2,fVar3);
  fVar2 = fmaxf(fVar2,fVar3);
  local_78._0_4_ = auVar9._0_4_;
  _Var1 = false;
  if ((fVar6 <= (float)local_78) && (_Var1 = false, (float)local_78 <= fVar2)) {
    fVar2 = fminf(__x,__y_00);
    fVar3 = fmaxf(__x,__y_00);
    _Var1 = false;
    if ((fVar2 <= (float)local_78) && ((float)local_78 <= fVar3)) {
      fVar3 = fminf(fVar4,__y);
      local_78._4_4_ = auVar9._4_4_;
      fVar2 = local_78._4_4_;
      fVar4 = fmaxf(fVar4,__y);
      _Var1 = false;
      if ((fVar3 <= local_78._4_4_) && (local_78._4_4_ <= fVar4)) {
        fVar4 = fminf(__x_00,__y_01);
        fVar3 = fmaxf(__x_00,__y_01);
        _Var1 = false;
        if (((fVar4 <= local_78._4_4_) && (local_78 = auVar9._0_8_, fVar2 <= fVar3)) &&
           (_Var1 = true, collisionPoint != (Vector2 *)0x0)) {
          *collisionPoint = local_78;
        }
      }
    }
  }
  return _Var1;
}

Assistant:

bool CheckCollisionLines(Vector2 startPos1, Vector2 endPos1, Vector2 startPos2, Vector2 endPos2, Vector2 *collisionPoint)
{
    const float div = (endPos2.y - startPos2.y)*(endPos1.x - startPos1.x) - (endPos2.x - startPos2.x)*(endPos1.y - startPos1.y);

    if (div == 0.0f) return false;      // WARNING: This check could not work due to float precision rounding issues...

    const float xi = ((startPos2.x - endPos2.x)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.x - endPos1.x)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;
    const float yi = ((startPos2.y - endPos2.y)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.y - endPos1.y)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;

    if (xi < fminf(startPos1.x, endPos1.x) || xi > fmaxf(startPos1.x, endPos1.x)) return false;
    if (xi < fminf(startPos2.x, endPos2.x) || xi > fmaxf(startPos2.x, endPos2.x)) return false;
    if (yi < fminf(startPos1.y, endPos1.y) || yi > fmaxf(startPos1.y, endPos1.y)) return false;
    if (yi < fminf(startPos2.y, endPos2.y) || yi > fmaxf(startPos2.y, endPos2.y)) return false;

    if (collisionPoint != 0)
    {
        collisionPoint->x = xi;
        collisionPoint->y = yi;
    }

    return true;
}